

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimPatSim(Gia_Man_t *pGia)

{
  ulong uVar1;
  Vec_Wrd_t *vSims;
  Gia_Obj_t *pGVar2;
  Vec_Wrd_t *in_R8;
  uint uVar3;
  int v;
  
  uVar1 = (long)pGia->vSimsPi->nSize / (long)pGia->vCis->nSize;
  vSims = Vec_WrdStart(pGia->nObjs * (int)uVar1);
  if (pGia->vSimsPi->nSize % pGia->vCis->nSize != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x81,"Vec_Wrd_t *Gia_ManSimPatSim(Gia_Man_t *)");
  }
  Gia_ManSimPatAssignInputs(pGia,(int)uVar1,vSims,pGia->vSimsPi);
  uVar3 = 0;
  while (((int)uVar3 < pGia->nObjs && (pGVar2 = Gia_ManObj(pGia,uVar3), pGVar2 != (Gia_Obj_t *)0x0))
        ) {
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Gia_ManSimPatSimAnd((Gia_Man_t *)(ulong)uVar3,(int)pGVar2,(Gia_Obj_t *)(uVar1 & 0xffffffff),
                          (int)vSims,in_R8);
    }
    uVar3 = uVar3 + 1;
  }
  v = 0;
  while( true ) {
    if (pGia->vCos->nSize <= v) {
      return vSims;
    }
    pGVar2 = Gia_ManCo(pGia,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjId(pGia,pGVar2);
    Gia_ManSimPatSimPo((Gia_Man_t *)(ulong)uVar3,(int)pGVar2,(Gia_Obj_t *)(uVar1 & 0xffffffff),
                       (int)vSims,in_R8);
    v = v + 1;
  }
  return vSims;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}